

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void ot::commissioner::CommissionerSafe::Invoke(int param_1,short param_2,void *aContext)

{
  bool bVar1;
  undefined1 local_40 [8];
  AsyncRequest asyncReq;
  CommissionerSafe *commissionerSafe;
  void *aContext_local;
  short param_1_local;
  int param_0_local;
  
  asyncReq._M_invoker = (_Invoker_type)aContext;
  if (aContext != (void *)0x0) {
    PopAsyncRequest((AsyncRequest *)local_40,(CommissionerSafe *)aContext);
    bVar1 = std::function::operator_cast_to_bool((function *)local_40);
    if (bVar1) {
      std::function<void_()>::operator()((function<void_()> *)local_40);
    }
    std::function<void_()>::~function((function<void_()> *)local_40);
    return;
  }
  abort();
}

Assistant:

void CommissionerSafe::Invoke(evutil_socket_t, short, void *aContext)
{
    auto commissionerSafe = reinterpret_cast<CommissionerSafe *>(aContext);

    VerifyOrDie(commissionerSafe != nullptr);

    if (auto asyncReq = commissionerSafe->PopAsyncRequest())
    {
        asyncReq();
    }
}